

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<long_double,_unsigned_long>::Run
          (DataTransform<long_double,_unsigned_long> *this,istream *input_stream)

{
  NumericType NVar1;
  WarningType WVar2;
  ulong uVar3;
  ulong uVar4;
  ostream *poVar5;
  size_t *__idx;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  allocator local_2a9;
  istream *local_2a8;
  string *local_2a0;
  ulong local_298;
  ulong local_290;
  long local_288;
  ulong local_280;
  ulong local_278;
  ulong local_270;
  longdouble local_268;
  string local_250;
  string word;
  char buffer [128];
  
  local_2a0 = &this->print_format_;
  iVar7 = 0;
  local_2a8 = input_stream;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(local_2a8,(string *)&word);
      bVar8 = word._M_string_length == 0;
      lVar11 = in_ST0;
      if (!bVar8) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        lVar11 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_268 = in_ST0;
      }
      in_ST0 = lVar11;
      std::__cxx11::string::~string((string *)&word);
      if (!bVar8) goto LAB_001373ba;
      if (bVar8) {
        if (bVar8) {
LAB_001376a3:
          bVar8 = true;
          if ((this->is_ascii_output_ == true) && (iVar7 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_001376c5:
          bVar8 = false;
        }
        return bVar8;
      }
    }
    else {
      bVar8 = sptk::ReadStream<long_double>(&local_268,local_2a8);
      if (!bVar8) goto LAB_001376a3;
LAB_001373ba:
      lVar9 = (longdouble)9.223372e+18;
      lVar11 = (longdouble)0;
      if (lVar9 <= local_268) {
        lVar11 = lVar9;
      }
      local_270 = (ulong)ROUND(local_268 - lVar11);
      uVar4 = (ulong)(lVar9 <= local_268) << 0x3f ^ local_270;
      uVar6 = this->minimum_value_;
      uVar3 = this->maximum_value_;
      in_ST5 = in_ST4;
      in_ST6 = in_ST4;
      if (uVar6 < uVar3) {
        NVar1 = this->input_numeric_type_;
        if (NVar1 == kFloatingPoint) {
          local_278 = uVar6;
          if (((longdouble)(long)uVar6 +
               (longdouble)*(float *)(&DAT_00140b30 + (ulong)((long)uVar6 < 0) * 4) <= local_268) &&
             (uVar6 = uVar3, local_280 = uVar3,
             local_268 <=
             (longdouble)(long)uVar3 +
             (longdouble)*(float *)(&DAT_00140b30 + (ulong)((long)uVar3 < 0) * 4)))
          goto LAB_001374cb;
        }
        else if (NVar1 == kUnsignedInteger) {
          if (uVar6 <= uVar4) {
            bVar8 = uVar3 < uVar4;
            uVar6 = uVar4;
            if (bVar8) {
              uVar6 = uVar3;
            }
            goto LAB_001374cd;
          }
        }
        else {
          if (NVar1 != kSignedInteger) goto LAB_001374cb;
          local_288 = (long)ROUND(local_268);
          if ((long)uVar6 <= local_288) {
            bVar8 = (long)uVar3 < local_288;
            uVar6 = uVar4;
            if ((long)uVar3 < local_288) {
              uVar6 = uVar3;
            }
            goto LAB_001374cd;
          }
        }
LAB_00137540:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar7);
          std::operator<<(poVar5,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_2a9);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar2 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          if (WVar2 == kExit) goto LAB_001376c5;
        }
      }
      else {
LAB_001374cb:
        bVar8 = false;
        uVar6 = uVar4;
LAB_001374cd:
        if ((bVar8) || (this->rounding_ == false)) {
          if (bVar8) goto LAB_00137540;
        }
        else if (local_268 <= (longdouble)0) {
          lVar9 = local_268 + (longdouble)-0.5;
          lVar10 = (longdouble)9.223372e+18;
          lVar11 = (longdouble)0;
          if (lVar10 <= lVar9) {
            lVar11 = lVar10;
          }
          local_290 = (ulong)ROUND(lVar9 - lVar11);
          uVar6 = (ulong)(lVar10 <= lVar9) << 0x3f ^ local_290;
        }
        else {
          lVar9 = local_268 + (longdouble)0.5;
          lVar10 = (longdouble)9.223372e+18;
          lVar11 = (longdouble)0;
          if (lVar10 <= lVar9) {
            lVar11 = lVar10;
          }
          local_298 = (ulong)ROUND(lVar9 - lVar11);
          uVar6 = (ulong)(lVar10 <= lVar9) << 0x3f ^ local_298;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar8 = sptk::SnPrintf<unsigned_long>(uVar6,local_2a0,0x80,buffer);
        if (!bVar8) goto LAB_001376c5;
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar7 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          in_ST7 = in_ST6;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          in_ST7 = in_ST6;
        }
      }
      else {
        bVar8 = sptk::WriteStream<unsigned_long>(uVar6,(ostream *)&std::cout);
        in_ST7 = in_ST6;
        if (!bVar8) goto LAB_001376c5;
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }